

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

int __thiscall
GF2::MP<6UL,_GF2::MOGrlex<6UL>_>::Compare
          (MP<6UL,_GF2::MOGrlex<6UL>_> *this,MP<6UL,_GF2::MOGrlex<6UL>_> *polyRight)

{
  bool bVar1;
  _List_const_iterator<GF2::MM<6UL>_> *this_00;
  MOGrlex<6UL> *this_01;
  long in_RDI;
  int cmp;
  const_iterator iterRight;
  const_iterator iter;
  list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *in_stack_ffffffffffffff88;
  bool local_59;
  _Self local_50;
  _Self local_48;
  int local_3c;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20 [3];
  int local_4;
  
  local_20[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                 (in_stack_ffffffffffffff88);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                 (in_stack_ffffffffffffff88);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                   (in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_20,&local_30);
    local_59 = false;
    if (bVar1) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                     (in_stack_ffffffffffffff88);
      local_59 = std::operator!=(&local_28,&local_38);
    }
    if (local_59 == false) break;
    this_00 = (_List_const_iterator<GF2::MM<6UL>_> *)(in_RDI + 0x18);
    this_01 = (MOGrlex<6UL> *)std::_List_const_iterator<GF2::MM<6UL>_>::operator*(this_00);
    std::_List_const_iterator<GF2::MM<6UL>_>::operator*(this_00);
    local_3c = MOGrlex<6UL>::Compare
                         (this_01,(MM<6UL> *)this_00,(MM<6UL> *)in_stack_ffffffffffffff88);
    if (local_3c != 0) {
      return local_3c;
    }
    std::_List_const_iterator<GF2::MM<6UL>_>::operator++(local_20);
    std::_List_const_iterator<GF2::MM<6UL>_>::operator++(&local_28);
  }
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                 (in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_20,&local_48);
  if (bVar1) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                   (in_stack_ffffffffffffff88);
    bVar1 = std::operator==(&local_28,&local_50);
    local_4 = -1;
    if (bVar1) {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Compare(const MP& polyRight) const
	{
		assert(IsConsistent(polyRight));
		// цикл по мономам
		const_iterator iter = begin(), iterRight = polyRight.begin();
		for (; iter != end() && iterRight != polyRight.end(); ++iter, ++iterRight)
			if (int cmp = _order.Compare(*iter, *iterRight))
				return cmp;
		// проверка хвостов
		if (iter == end()) 
			return iterRight == polyRight.end() ? 0 : -1;
        return 1;
	}